

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_sink_set.cc
# Opt level: O0

GlobalLogSinkSet * absl::lts_20250127::log_internal::anon_unknown_0::GlobalSinks(void)

{
  int iVar1;
  GlobalLogSinkSet *pGVar2;
  
  if ((anonymous_namespace)::GlobalSinks()::global_sinks == '\0') {
    iVar1 = __cxa_guard_acquire(&(anonymous_namespace)::GlobalSinks()::global_sinks);
    if (iVar1 != 0) {
      NoDestructor<absl::lts_20250127::log_internal::(anonymous_namespace)::GlobalLogSinkSet>::
      NoDestructor<0>(&GlobalSinks::global_sinks);
      __cxa_guard_release(&(anonymous_namespace)::GlobalSinks()::global_sinks);
    }
  }
  pGVar2 = NoDestructor<absl::lts_20250127::log_internal::(anonymous_namespace)::GlobalLogSinkSet>::
           operator*(&GlobalSinks::global_sinks);
  return pGVar2;
}

Assistant:

GlobalLogSinkSet& GlobalSinks() {
  static absl::NoDestructor<GlobalLogSinkSet> global_sinks;
  return *global_sinks;
}